

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeConfig.cpp
# Opt level: O0

int __thiscall cali::RuntimeConfig::init(RuntimeConfig *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  element_type *name;
  pointer in_RCX;
  config_entry_list_t *in_RDX;
  bool bVar2;
  undefined1 local_f8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  pointer local_48;
  Entry *e;
  config_entry_list_t converted_list;
  Entry *list_local;
  char *name_local;
  RuntimeConfig *this_local;
  
  converted_list.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_RCX;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&e);
  local_48 = converted_list.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  while( true ) {
    bVar2 = false;
    if (local_48 != (pointer)0x0) {
      bVar2 = *(long *)&local_48->first != 0;
    }
    if (!bVar2) break;
    pcVar1 = *(char **)&local_48->first;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,pcVar1,&local_a9);
    pcVar1 = (char *)(local_48->first).field_2._M_allocated_capacity;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,pcVar1,(allocator<char> *)(local_f8 + 0x17));
    std::make_pair<std::__cxx11::string,std::__cxx11::string>(&local_88,&local_a8,&local_e0);
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&e,&local_88);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_88);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)(local_f8 + 0x17));
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    local_48 = (pointer)&(local_48->second)._M_string_length;
  }
  name = std::
         __shared_ptr_access<cali::RuntimeConfig::RuntimeConfigImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<cali::RuntimeConfig::RuntimeConfigImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)ctx);
  RuntimeConfigImpl::init_configset((RuntimeConfigImpl *)local_f8,&name->m_allow_read_env,in_RDX);
  ConfigSet::ConfigSet((ConfigSet *)this,(shared_ptr<cali::ConfigSetImpl> *)local_f8);
  std::shared_ptr<cali::ConfigSetImpl>::~shared_ptr((shared_ptr<cali::ConfigSetImpl> *)local_f8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&e);
  return (int)this;
}

Assistant:

ConfigSet RuntimeConfig::init(const char* name, const ConfigSet::Entry* list)
{
    config_entry_list_t converted_list;

    for (const ConfigSet::Entry* e = list; e && e->key; ++e)
        converted_list.emplace_back(std::make_pair<std::string, std::string>(e->key, e->value));

    return ConfigSet(mP->init_configset(name, converted_list));
}